

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O0

function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> * __thiscall
gmlc::libguarded::
atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
::load(atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
       *this)

{
  function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *in_RSI;
  function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *in_RDI;
  lock_guard<std::mutex> glock;
  mutex_type *in_stack_ffffffffffffffb8;
  function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *__x;
  
  __x = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffb8);
  std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>::function
            (in_RSI,__x);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x27a9be);
  return in_RDI;
}

Assistant:

T load() const
    {
        std::lock_guard<M> glock(m_mutex);
        return m_obj;
    }